

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

double benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                 (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                  *A,matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *B,matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *C)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 local_50;
  Timer time;
  
  dVar7 = 1.79769313486232e+308;
  lVar2 = 10;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    Timer::Timer(&time,true);
    local_90 = *(undefined8 *)(A + 0x10);
    local_70 = *(undefined8 *)(B + 0x10);
    local_88 = *(undefined8 *)A;
    uStack_80 = *(undefined8 *)(A + 8);
    local_68 = *(undefined4 *)B;
    uStack_64 = *(undefined4 *)(B + 4);
    uStack_60 = *(undefined4 *)(B + 8);
    uStack_5c = *(undefined4 *)(B + 0xc);
    local_50 = 0x3ff0000000000000;
    local_a8 = *(undefined8 *)C;
    local_a0 = *(undefined8 *)(C + 8);
    local_b0 = *(undefined8 *)(C + 0x10);
    local_98 = local_a0;
    local_78 = local_88;
    local_58 = local_68;
    uStack_54 = uStack_64;
    remora::
    matrix_matrix_prod<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
    ::
    plus_assign_to<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::continuous_dense_tag>
              ((matrix_matrix_prod<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                *)&local_90,&local_b0);
    dVar1 = Timer::stop(&time);
    uVar4 = SUB84(dVar1,0);
    uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
    if (dVar7 <= dVar1) {
      uVar4 = SUB84(dVar7,0);
      uVar5 = (undefined4)((ulong)dVar7 >> 0x20);
    }
    dVar7 = (double)CONCAT44(uVar5,uVar4);
  }
  lVar2 = *(long *)(A + 8) * *(long *)A * *(long *)(B + 8);
  auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar6._0_8_ = lVar2;
  auVar6._12_4_ = 0x45300000;
  return (((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / dVar7) * 0.0009765625 *
         0.0009765625;
}

Assistant:

double benchmark(
	matrix_expression<AMat, cpu_tag> const& A,
	matrix_expression<BMat, cpu_tag> const& B,
	matrix_expression<CMat, cpu_tag> & C
){
	double minTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != 10; ++i){
		Timer time;
		noalias(C) += prod(A,B);
		minTime = std::min(minTime,time.stop());
	}
	return (A().size1()*A().size2()*B().size2())/minTime/1024/1024;
}